

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall
QMap<QSettingsKey,_QByteArray>::upperBound(QMap<QSettingsKey,_QByteArray> *this,QSettingsKey *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMap<QSettingsKey,_QByteArray> copy;
  iterator in_stack_ffffffffffffff98;
  QMap<QSettingsKey,_QByteArray> *in_stack_ffffffffffffffa0;
  undefined1 *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffffa0->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffffa0,
         (QMap<QSettingsKey,_QByteArray> *)in_stack_ffffffffffffff98._M_node);
  }
  else {
    memset(&local_18,0,8);
    QMap((QMap<QSettingsKey,_QByteArray> *)0x7bad4d);
  }
  detach(in_stack_ffffffffffffffa0);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>_>
                *)0x7bad63);
  std::
  map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>
  ::upper_bound((map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>
                 *)in_stack_ffffffffffffff98._M_node,(key_type *)0x7bad74);
  iterator::iterator((iterator *)0x7bad94,in_stack_ffffffffffffff98);
  ~QMap((QMap<QSettingsKey,_QByteArray> *)0x7bada0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator upperBound(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.upper_bound(key));
    }